

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_string_localeCompare(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValueUnion JVar1;
  int64_t iVar2;
  JSValue JVar3;
  JSValue v;
  
  JVar3 = JS_ToStringCheckObject(ctx,this_val);
  iVar2 = 6;
  if ((int)JVar3.tag != 6) {
    v = JS_ToString(ctx,*argv);
    if ((int)v.tag != 6) {
      JVar1._0_4_ = js_string_compare((JSContext *)JVar3.u.ptr,(JSString *)v.u.ptr,(JSString *)v.tag
                                     );
      JS_FreeValue(ctx,JVar3);
      JS_FreeValue(ctx,v);
      JVar1._4_4_ = 0;
      iVar2 = 0;
      goto LAB_001597f3;
    }
    JS_FreeValue(ctx,JVar3);
  }
  JVar1.float64 = 0.0;
LAB_001597f3:
  JVar3.tag = iVar2;
  JVar3.u.float64 = JVar1.float64;
  return JVar3;
}

Assistant:

static JSValue js_string_localeCompare(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    JSValue a, b;
    int cmp;

    a = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(a))
        return JS_EXCEPTION;
    b = JS_ToString(ctx, argv[0]);
    if (JS_IsException(b)) {
        JS_FreeValue(ctx, a);
        return JS_EXCEPTION;
    }
    cmp = js_string_compare(ctx, JS_VALUE_GET_STRING(a), JS_VALUE_GET_STRING(b));
    JS_FreeValue(ctx, a);
    JS_FreeValue(ctx, b);
    return JS_NewInt32(ctx, cmp);
}